

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O3

void yajl_string_encode(yajl_print_t print,void *ctx,uchar *str,size_t len,int escape_solidus)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  char *__s;
  ulong uVar4;
  long lVar5;
  char local_3c [5];
  char local_37;
  undefined1 local_36;
  int local_34;
  
  builtin_strncpy(local_3c,"\\u00",4);
  local_36 = 0;
  local_34 = escape_solidus;
  if (len == 0) {
    lVar5 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    lVar5 = 0;
    do {
      bVar1 = str[uVar4];
      uVar3 = (uint)bVar1;
      if (0x21 < bVar1) {
        if (bVar1 == 0x22) {
          __s = "\\\"";
        }
        else if (uVar3 == 0x2f) {
          __s = "\\/";
          if (local_34 == 0) goto LAB_00104942;
        }
        else {
          if (uVar3 != 0x5c) goto switchD_0010489d_caseD_b;
          __s = "\\\\";
        }
        goto switchD_0010489d_caseD_d;
      }
      __s = "\\r";
      switch(bVar1) {
      case 8:
        __s = "\\b";
        break;
      case 9:
        __s = "\\t";
        break;
      case 10:
        __s = "\\n";
        break;
      default:
switchD_0010489d_caseD_b:
        if (bVar1 < 0x20) {
          local_3c[4] = "0123456789ABCDEF"[bVar1 >> 4];
          local_37 = "0123456789ABCDEF"[uVar3 & 0xf];
          __s = local_3c;
          break;
        }
        goto LAB_00104942;
      case 0xc:
        __s = "\\f";
        break;
      case 0xd:
        break;
      }
switchD_0010489d_caseD_d:
      (*print)(ctx,(char *)(str + lVar5),uVar4 - lVar5);
      sVar2 = strlen(__s);
      (*print)(ctx,__s,sVar2 & 0xffffffff);
      lVar5 = uVar4 + 1;
LAB_00104942:
      uVar4 = uVar4 + 1;
    } while (uVar4 < len);
  }
  (*print)(ctx,(char *)(str + lVar5),uVar4 - lVar5);
  return;
}

Assistant:

void
yajl_string_encode(const yajl_print_t print,
                   void * ctx,
                   const unsigned char * str,
                   size_t len,
                   int escape_solidus)
{
    size_t beg = 0;
    size_t end = 0;
    char hexBuf[7];
    hexBuf[0] = '\\'; hexBuf[1] = 'u'; hexBuf[2] = '0'; hexBuf[3] = '0';
    hexBuf[6] = 0;

    while (end < len) {
        const char * escaped = NULL;
        switch (str[end]) {
            case '\r': escaped = "\\r"; break;
            case '\n': escaped = "\\n"; break;
            case '\\': escaped = "\\\\"; break;
            /* it is not required to escape a solidus in JSON:
             * read sec. 2.5: http://www.ietf.org/rfc/rfc4627.txt
             * specifically, this production from the grammar:
             *   unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
             */
            case '/': if (escape_solidus) escaped = "\\/"; break;
            case '"': escaped = "\\\""; break;
            case '\f': escaped = "\\f"; break;
            case '\b': escaped = "\\b"; break;
            case '\t': escaped = "\\t"; break;
            default:
                if ((unsigned char) str[end] < 32) {
                    CharToHex(str[end], hexBuf + 4);
                    escaped = hexBuf;
                }
                break;
        }
        if (escaped != NULL) {
            print(ctx, (const char *) (str + beg), end - beg);
            print(ctx, escaped, (unsigned int)strlen(escaped));
            beg = ++end;
        } else {
            ++end;
        }
    }
    print(ctx, (const char *) (str + beg), end - beg);
}